

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModel.cpp
# Opt level: O2

ParameterDeclarationSymbol * __thiscall
psy::C::SemanticModel::parameterFor(SemanticModel *this,ParameterDeclarationSyntax *node)

{
  SymbolKind SVar1;
  int iVar2;
  Symbol *this_00;
  undefined4 extraout_var;
  ostream *poVar3;
  
  this_00 = &declarationBy(this,node->decltor_)->super_Symbol;
  if (this_00 == (Symbol *)0x0) {
    if (((this->impl_)._M_t.
         super___uniq_ptr_impl<psy::C::SemanticModel::SemanticModelImpl,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
         ._M_t.
         super__Tuple_impl<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
         .super__Head_base<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_false>._M_head_impl)->
        bindingIsOK_ != true) {
      return (ParameterDeclarationSymbol *)0x0;
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/SemanticModel.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    iVar2 = 0xa5;
  }
  else {
    SVar1 = Symbol::kind(this_00);
    if (SVar1 == ParameterDeclaration) {
      iVar2 = (*this_00->_vptr_Symbol[0xe])(this_00);
      return (ParameterDeclarationSymbol *)CONCAT44(extraout_var,iVar2);
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/SemanticModel.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    iVar2 = 0xa8;
  }
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,"<empty message>");
  std::endl<char,std::char_traits<char>>(poVar3);
  return (ParameterDeclarationSymbol *)0x0;
}

Assistant:

ParameterDeclarationSymbol* SemanticModel::parameterFor(const ParameterDeclarationSyntax* node)
{
    auto decl = declarationBy(node->declarator());
    if (!decl) {
        PSY_ASSERT_1(!P->bindingIsOK_);
        return nullptr;
    }
    PSY_ASSERT_2(decl->kind() == SymbolKind::ParameterDeclaration, return nullptr);
    auto parmDecl = decl->asParameterDeclaration();
    return parmDecl;
}